

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDefinePropertyCommand.cxx
# Opt level: O3

bool __thiscall
cmDefinePropertyCommand::InitialPass
          (cmDefinePropertyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  cmState *this_00;
  uint uVar5;
  pointer pbVar6;
  ulong uVar7;
  ostringstream e;
  ScopeType local_1f0;
  bool local_1ec;
  string local_1e0;
  string *local_1c0;
  string *local_1b8;
  string *local_1b0;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  pbVar6 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pbVar6) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)pbVar6);
    if (iVar1 == 0) {
      local_1f0 = GLOBAL;
    }
    else {
      iVar1 = std::__cxx11::string::compare
                        ((char *)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
      if (iVar1 == 0) {
        local_1f0 = DIRECTORY;
      }
      else {
        iVar1 = std::__cxx11::string::compare
                          ((char *)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start);
        if (iVar1 == 0) {
          local_1f0 = TARGET;
        }
        else {
          iVar1 = std::__cxx11::string::compare
                            ((char *)(args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start);
          if (iVar1 == 0) {
            local_1f0 = SOURCE_FILE;
          }
          else {
            iVar1 = std::__cxx11::string::compare
                              ((char *)(args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start);
            if (iVar1 == 0) {
              local_1f0 = TEST;
            }
            else {
              iVar1 = std::__cxx11::string::compare
                                ((char *)(args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start);
              if (iVar1 == 0) {
                local_1f0 = VARIABLE;
              }
              else {
                iVar1 = std::__cxx11::string::compare
                                  ((char *)(args->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start);
                if (iVar1 != 0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"given invalid scope ",0x14);
                  pbVar6 = (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_1a8,(pbVar6->_M_dataplus)._M_p,
                                      pbVar6->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar4,".  ",3);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar4,"Valid scopes are ",0x11);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar4,"GLOBAL, DIRECTORY, TARGET, SOURCE, ",0x23);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar4,"TEST, VARIABLE, CACHED_VARIABLE.",0x20);
                  std::__cxx11::stringbuf::str();
                  cmCommand::SetError(&this->super_cmCommand,&local_1e0);
LAB_0035d0fb:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                    operator_delete(local_1e0._M_dataplus._M_p,
                                    local_1e0.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                  std::ios_base::~ios_base(local_138);
                  return false;
                }
                local_1f0 = CACHED_VARIABLE;
              }
            }
          }
        }
      }
    }
    pbVar6 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    iVar1 = 0;
    local_1ec = false;
    if (0x20 < (ulong)((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6)) {
      local_1b0 = &this->FullDocs;
      local_1b8 = &this->BriefDocs;
      local_1c0 = (string *)&this->PropertyName;
      uVar7 = 1;
      uVar5 = 2;
      local_1ec = false;
      do {
        iVar2 = std::__cxx11::string::compare((char *)(pbVar6 + uVar7));
        if (iVar2 == 0) {
          iVar2 = 1;
        }
        else {
          iVar3 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar7));
          iVar2 = 2;
          if (iVar3 != 0) {
            iVar3 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar7));
            iVar2 = 3;
            if (iVar3 != 0) {
              iVar2 = std::__cxx11::string::compare
                                ((char *)((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar7));
              if (iVar2 == 0) {
                local_1ec = true;
                iVar2 = 0;
              }
              else if (iVar1 == 3) {
                std::__cxx11::string::_M_append
                          ((char *)local_1b0,
                           (ulong)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start[uVar7]._M_dataplus._M_p
                          );
                iVar2 = 3;
              }
              else if (iVar1 == 2) {
                std::__cxx11::string::_M_append
                          ((char *)local_1b8,
                           (ulong)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start[uVar7]._M_dataplus._M_p
                          );
                iVar2 = 2;
              }
              else {
                if (iVar1 != 1) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"given invalid argument \"",0x18);
                  pbVar6 = (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_1a8,pbVar6[uVar7]._M_dataplus._M_p,
                                      pbVar6[uVar7]._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\".",2);
                  std::__cxx11::stringbuf::str();
                  cmCommand::SetError(&this->super_cmCommand,&local_1e0);
                  goto LAB_0035d0fb;
                }
                std::__cxx11::string::_M_assign(local_1c0);
                iVar2 = 0;
              }
            }
          }
        }
        iVar1 = iVar2;
        uVar7 = (ulong)uVar5;
        pbVar6 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar5 = uVar5 + 1;
      } while (uVar7 < (ulong)((long)(args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >> 5
                              ));
    }
    if ((this->PropertyName)._M_string_length == 0) {
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"not given a PROPERTY <name> argument.","");
      cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    }
    else if ((this->BriefDocs)._M_string_length == 0) {
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"not given a BRIEF_DOCS <brief-doc> argument.","");
      cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    }
    else {
      if ((this->FullDocs)._M_string_length != 0) {
        this_00 = cmMakefile::GetState((this->super_cmCommand).Makefile);
        cmState::DefineProperty
                  (this_00,&this->PropertyName,local_1f0,(this->BriefDocs)._M_dataplus._M_p,
                   (this->FullDocs)._M_dataplus._M_p,local_1ec);
        return true;
      }
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"not given a FULL_DOCS <full-doc> argument.","");
      cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    }
  }
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool cmDefinePropertyCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1)
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  // Get the scope in which to define the property.
  cmProperty::ScopeType scope;
  if(args[0] == "GLOBAL")
    {
    scope = cmProperty::GLOBAL;
    }
  else if(args[0] == "DIRECTORY")
    {
    scope = cmProperty::DIRECTORY;
    }
  else if(args[0] == "TARGET")
    {
    scope = cmProperty::TARGET;
    }
  else if(args[0] == "SOURCE")
    {
    scope = cmProperty::SOURCE_FILE;
    }
  else if(args[0] == "TEST")
    {
    scope = cmProperty::TEST;
    }
  else if(args[0] == "VARIABLE")
    {
    scope = cmProperty::VARIABLE;
    }
  else if (args[0] == "CACHED_VARIABLE")
    {
    scope = cmProperty::CACHED_VARIABLE;
    }
  else
    {
    std::ostringstream e;
    e << "given invalid scope " << args[0] << ".  "
      << "Valid scopes are "
      << "GLOBAL, DIRECTORY, TARGET, SOURCE, "
      << "TEST, VARIABLE, CACHED_VARIABLE.";
    this->SetError(e.str());
    return false;
    }

  // Parse remaining arguments.
  bool inherited = false;
  enum Doing { DoingNone, DoingProperty, DoingBrief, DoingFull };
  Doing doing = DoingNone;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    if(args[i] == "PROPERTY")
      {
      doing = DoingProperty;
      }
    else if(args[i] == "BRIEF_DOCS")
      {
      doing = DoingBrief;
      }
    else if(args[i] == "FULL_DOCS")
      {
      doing = DoingFull;
      }
    else if(args[i] == "INHERITED")
      {
      doing = DoingNone;
      inherited = true;
      }
    else if(doing == DoingProperty)
      {
      doing = DoingNone;
      this->PropertyName = args[i];
      }
    else if(doing == DoingBrief)
      {
      this->BriefDocs += args[i];
      }
    else if(doing == DoingFull)
      {
      this->FullDocs += args[i];
      }
    else
      {
      std::ostringstream e;
      e << "given invalid argument \"" << args[i] << "\".";
      this->SetError(e.str());
      return false;
      }
    }

  // Make sure a property name was found.
  if(this->PropertyName.empty())
    {
    this->SetError("not given a PROPERTY <name> argument.");
    return false;
    }

  // Make sure documentation was given.
  if(this->BriefDocs.empty())
    {
    this->SetError("not given a BRIEF_DOCS <brief-doc> argument.");
    return false;
    }
  if(this->FullDocs.empty())
    {
    this->SetError("not given a FULL_DOCS <full-doc> argument.");
    return false;
    }

  // Actually define the property.
  this->Makefile->GetState()->DefineProperty
    (this->PropertyName, scope,
     this->BriefDocs.c_str(), this->FullDocs.c_str(), inherited);

  return true;
}